

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPU4StateImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPU4StateImpl<float,_1,_0>::calcRootLogLikelihoods
          (BeagleCPU4StateImpl<float,_1,_0> *this,int bufferIndex,int categoryWeightsIndex,
          int stateFrequenciesIndex,int scalingFactorsIndex,double *outSumLogLikelihood)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  float *pfVar8;
  float *pfVar9;
  double *pdVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  long lVar17;
  float *pfVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined8 in_XMM2_Qb;
  
  pfVar18 = (this->super_BeagleCPUImpl<float,_1,_0>).gPartials[bufferIndex];
  pfVar8 = (this->super_BeagleCPUImpl<float,_1,_0>).gCategoryWeights[categoryWeightsIndex];
  uVar6 = (this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
  uVar11 = (ulong)uVar6;
  if ((int)uVar6 < 1) {
    uVar13 = 0;
  }
  else {
    fVar1 = *pfVar8;
    pfVar9 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
    uVar13 = 0;
    uVar15 = uVar6;
    do {
      pfVar9[uVar13] = fVar1 * pfVar18[uVar13];
      pfVar9[uVar13 + 1] = fVar1 * pfVar18[uVar13 + 1];
      pfVar9[uVar13 + 2] = fVar1 * pfVar18[uVar13 + 2];
      pfVar9[uVar13 + 3] = fVar1 * pfVar18[uVar13 + 3];
      uVar13 = uVar13 + 4;
      uVar15 = uVar15 - 1;
    } while (uVar15 != 0);
  }
  lVar14 = (long)(this->super_BeagleCPUImpl<float,_1,_0>).kCategoryCount;
  if (1 < lVar14) {
    pfVar9 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp;
    iVar7 = (this->super_BeagleCPUImpl<float,_1,_0>).kExtraPatterns;
    lVar16 = 1;
    do {
      iVar12 = (int)uVar13;
      if (0 < (int)uVar6) {
        fVar1 = pfVar8[lVar16];
        lVar17 = 0;
        uVar15 = uVar6;
        do {
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)pfVar18[iVar12 + lVar17]),ZEXT416((uint)fVar1),
                                    ZEXT416((uint)pfVar9[lVar17]));
          pfVar9[lVar17] = auVar20._0_4_;
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)pfVar18[(long)iVar12 + lVar17 + 1]),
                                    ZEXT416((uint)fVar1),ZEXT416((uint)pfVar9[lVar17 + 1]));
          pfVar9[lVar17 + 1] = auVar20._0_4_;
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)pfVar18[(long)iVar12 + lVar17 + 2]),
                                    ZEXT416((uint)fVar1),ZEXT416((uint)pfVar9[lVar17 + 2]));
          pfVar9[lVar17 + 2] = auVar20._0_4_;
          auVar20 = vfmadd213ss_fma(ZEXT416((uint)pfVar18[(long)iVar12 + lVar17 + 3]),
                                    ZEXT416((uint)fVar1),ZEXT416((uint)pfVar9[lVar17 + 3]));
          pfVar9[lVar17 + 3] = auVar20._0_4_;
          lVar17 = lVar17 + 4;
          uVar15 = uVar15 - 1;
        } while (uVar15 != 0);
        iVar12 = iVar12 + (int)lVar17;
      }
      uVar13 = (ulong)(uint)(iVar12 + iVar7 * 4);
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar14);
  }
  if (0 < (int)uVar6) {
    pfVar18 = (this->super_BeagleCPUImpl<float,_1,_0>).gStateFrequencies[stateFrequenciesIndex];
    fVar1 = *pfVar18;
    fVar2 = pfVar18[1];
    fVar3 = pfVar18[2];
    fVar4 = pfVar18[3];
    pfVar18 = (this->super_BeagleCPUImpl<float,_1,_0>).integrationTmp + 3;
    lVar14 = 0;
    do {
      auVar20 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * pfVar18[-2])),ZEXT416((uint)fVar1),
                                ZEXT416((uint)pfVar18[-3]));
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar3),ZEXT416((uint)pfVar18[-1]));
      auVar20 = vfmadd231ss_fma(auVar20,ZEXT416((uint)fVar4),ZEXT416((uint)*pfVar18));
      dVar19 = log((double)auVar20._0_4_);
      (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp[lVar14] = (float)dVar19;
      lVar14 = lVar14 + 1;
      uVar11 = (ulong)(this->super_BeagleCPUImpl<float,_1,_0>).kPatternCount;
      pfVar18 = pfVar18 + 4;
    } while (lVar14 < (long)uVar11);
  }
  if ((scalingFactorsIndex != -1) && (0 < (int)uVar11)) {
    pfVar18 = (this->super_BeagleCPUImpl<float,_1,_0>).gScaleBuffers[scalingFactorsIndex];
    pfVar8 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
    uVar13 = 0;
    do {
      pfVar8[uVar13] = pfVar18[uVar13] + pfVar8[uVar13];
      uVar13 = uVar13 + 1;
    } while ((uVar11 & 0xffffffff) != uVar13);
  }
  *outSumLogLikelihood = 0.0;
  if (0 < (int)uVar11) {
    pdVar10 = (this->super_BeagleCPUImpl<float,_1,_0>).gPatternWeights;
    pfVar18 = (this->super_BeagleCPUImpl<float,_1,_0>).outLogLikelihoodsTmp;
    auVar20 = ZEXT816(0) << 0x40;
    uVar13 = 0;
    do {
      auVar21._0_8_ = (double)pfVar18[uVar13];
      auVar21._8_8_ = in_XMM2_Qb;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = pdVar10[uVar13];
      auVar20 = vfmadd231sd_fma(auVar20,auVar21,auVar5);
      *outSumLogLikelihood = auVar20._0_8_;
      uVar13 = uVar13 + 1;
    } while ((uVar11 & 0xffffffff) != uVar13);
  }
  return (uint)(!NAN(*outSumLogLikelihood) && !NAN(*outSumLogLikelihood)) * 8 + -8;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPU4StateImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoods(const int bufferIndex,
                                                           const int categoryWeightsIndex,
                                                           const int stateFrequenciesIndex,
                                                const int scalingFactorsIndex,
                                                double* outSumLogLikelihood) {

    const REALTYPE* rootPartials = gPartials[bufferIndex];
    assert(rootPartials);
    const REALTYPE* wt = gCategoryWeights[categoryWeightsIndex];

    int u = 0;
    int v = 0;
    const REALTYPE wt0 = wt[0];
    for (int k = 0; k < kPatternCount; k++) {
        integrationTmp[v    ] = rootPartials[v    ] * wt0;
        integrationTmp[v + 1] = rootPartials[v + 1] * wt0;
        integrationTmp[v + 2] = rootPartials[v + 2] * wt0;
        integrationTmp[v + 3] = rootPartials[v + 3] * wt0;
        v += 4;
    }
    for (int l = 1; l < kCategoryCount; l++) {
        u = 0;
        const REALTYPE wtl = wt[l];
        for (int k = 0; k < kPatternCount; k++) {
            integrationTmp[u    ] += rootPartials[v    ] * wtl;
            integrationTmp[u + 1] += rootPartials[v + 1] * wtl;
            integrationTmp[u + 2] += rootPartials[v + 2] * wtl;
            integrationTmp[u + 3] += rootPartials[v + 3] * wtl;

            u += 4;
            v += 4;
        }
		v += 4 * kExtraPatterns;
    }

    return integrateOutStatesAndScale(integrationTmp, stateFrequenciesIndex, scalingFactorsIndex, outSumLogLikelihood);
}